

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_gc.c
# Opt level: O3

void zt_gc_destroy(zt_gc_t *gc)

{
  zt_elist *pzVar1;
  zt_elist *pzVar2;
  
  if (gc->enabled != 0) {
    puts("# Warning: destroying gc while gc is disabled");
    gc->enabled = 0;
  }
  zt_gc_collect(gc,1);
  zt_gc_destroy::elt = gc->white->next;
  if (zt_gc_destroy::elt != gc->white) {
    do {
      pzVar1 = zt_gc_destroy::elt->prev;
      pzVar2 = zt_gc_destroy::elt->next;
      pzVar2->prev = pzVar1;
      pzVar1->next = pzVar2;
      (*gc->release_fn)(gc,gc->private_data,&zt_gc_destroy::elt);
      zt_gc_destroy::elt = pzVar2;
    } while (pzVar2 != gc->white);
  }
  zt_gc_destroy::elt = gc->grey->next;
  if (zt_gc_destroy::elt != gc->grey) {
    do {
      pzVar1 = zt_gc_destroy::elt->prev;
      pzVar2 = zt_gc_destroy::elt->next;
      pzVar2->prev = pzVar1;
      pzVar1->next = pzVar2;
      (*gc->release_fn)(gc,gc->private_data,&zt_gc_destroy::elt);
      zt_gc_destroy::elt = pzVar2;
    } while (pzVar2 != gc->grey);
  }
  zt_gc_destroy::elt = gc->black->next;
  if (zt_gc_destroy::elt != gc->black) {
    do {
      pzVar1 = zt_gc_destroy::elt->prev;
      pzVar2 = zt_gc_destroy::elt->next;
      pzVar2->prev = pzVar1;
      pzVar1->next = pzVar2;
      (*gc->release_fn)(gc,gc->private_data,&zt_gc_destroy::elt);
      zt_gc_destroy::elt = pzVar2;
    } while (pzVar2 != gc->black);
  }
  gc->enabled = 1;
  return;
}

Assistant:

void
zt_gc_destroy(zt_gc_t *gc)
{
    static zt_elist_t * elt;
    zt_elist_t * dont_use;

    if (gc->enabled != 0) {
        printf("# Warning: destroying gc while gc is disabled\n");
        gc->enabled = 0;
    }

    zt_gc_collect(gc, TRUE);

    zt_elist_for_each_safe(gc->white, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    zt_elist_for_each_safe(gc->grey, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    zt_elist_for_each_safe(gc->black, elt, dont_use) {
        zt_elist_remove(elt);
        gc->release_fn(gc, gc->private_data, (void **)&elt);
    }

    gc->enabled = 1;
}